

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

void cppjieba::GetWordsFromWordRanges
               (string *s,vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *wrs,
               vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *in_RSI;
  value_type *in_RDI;
  size_t i;
  value_type *__x;
  const_iterator this;
  const_iterator in_stack_ffffffffffffffc8;
  const_iterator in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size(in_RSI);
    if (sVar1 <= local_20) break;
    __x = in_RDI;
    pvVar2 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                       (in_RSI,local_20);
    this = pvVar2->left;
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
              (in_RSI,local_20);
    GetWordFromRunes(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::push_back
              ((vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *)this,__x);
    Word::~Word((Word *)0x1a5bfa);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

inline void GetWordsFromWordRanges(const string& s, const vector<WordRange>& wrs, vector<Word>& words) {
  for (size_t i = 0; i < wrs.size(); i++) {
    words.push_back(GetWordFromRunes(s, wrs[i].left, wrs[i].right));
  }
}